

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O3

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  uint uVar6;
  uint _w;
  undefined4 uVar7;
  void *pvVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  uint uVar24;
  int *piVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  void *pvVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  void *pvVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  void *pvVar42;
  void *pvVar43;
  void *pvVar44;
  Allocator *pAVar45;
  void *pvVar46;
  void *pvVar47;
  void *pvVar48;
  void *pvVar49;
  ulong uVar50;
  ulong uVar51;
  void *pvVar52;
  Allocator *pAVar53;
  int iVar54;
  long lVar55;
  Allocator *pAVar56;
  int iVar57;
  void *pvVar58;
  uint uVar59;
  long lVar60;
  void *pvVar61;
  Allocator *pAVar62;
  void *pvVar63;
  void *pvVar64;
  long lVar65;
  void *pvVar66;
  void *pvVar67;
  ulong uVar68;
  void *pvVar69;
  void *pvVar70;
  long lVar71;
  void *pvVar72;
  void *pvVar73;
  ulong uVar74;
  uint uVar75;
  long lVar76;
  void *pvVar77;
  long lVar78;
  void *pvVar79;
  float fVar80;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar87 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [16];
  float fVar125;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar130 [64];
  float fVar135;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 in_ZMM5 [64];
  undefined1 auVar139 [64];
  undefined1 auVar146 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [16];
  undefined1 in_ZMM9 [64];
  float fVar152;
  undefined1 auVar151 [32];
  undefined1 in_ZMM10 [64];
  float *bias_c_I;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_F;
  float *bias_c_F;
  float *bias_c_G;
  float *bias_c_O;
  float *gates_data_I;
  void *local_2f0;
  void *local_2e0;
  void *local_2d8;
  void *local_2d0;
  void *local_2b0;
  void *local_290;
  void *local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  void *local_250;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  Mat local_78;
  undefined1 auVar112 [32];
  undefined1 auVar118 [32];
  undefined1 auVar121 [32];
  undefined1 auVar129 [32];
  
  uVar75 = bottom_blob->w;
  uVar6 = bottom_blob->h;
  _w = top_blob->w;
  uVar50 = (ulong)_w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,_w,4,4,(Allocator *)opt);
  iVar27 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    if (0 < (int)uVar6) {
      uVar74 = (ulong)(int)_w;
      uVar37 = uVar74 & 0xfffffffffffffffe;
      uVar24 = _w * 2;
      uVar41 = (ulong)uVar24;
      uVar11 = _w * 3;
      uVar51 = (ulong)uVar11;
      iVar54 = (int)uVar75 >> 3;
      uVar75 = uVar75 & 7;
      iVar57 = (int)_w >> 3;
      uVar59 = _w & 7;
      uVar26 = iVar57 + 1;
      iVar27 = uVar59 + 1;
      lVar1 = (long)(int)uVar11 + uVar37;
      lVar2 = (long)(int)uVar24 + uVar37;
      uVar29 = 0;
      do {
        uVar36 = ~uVar29 + uVar6;
        if (reverse == 0) {
          uVar36 = uVar29;
        }
        local_2e0 = hidden_state->data;
        lVar30 = (long)local_78.w;
        if (1 < (int)_w) {
          pvVar46 = (void *)((long)(int)uVar36 * (long)bottom_blob->w * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          pvVar47 = bias_c->data;
          lVar31 = (long)bias_c->w * bias_c->elemsize;
          lVar32 = local_78.elemsize * lVar30;
          lVar65 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar73 = weight_xc->data;
          lVar76 = (long)weight_hc->w * weight_hc->elemsize;
          local_250 = (void *)(lVar65 * uVar50 + (long)pvVar73);
          pvVar48 = (void *)(lVar65 * uVar41 + (long)pvVar73);
          pvVar69 = (void *)(lVar65 * uVar51 + (long)pvVar73);
          pvVar58 = (void *)(lVar65 * (uVar50 + 1) + (long)pvVar73);
          pvVar52 = (void *)(lVar65 * (uVar41 + 1) + (long)pvVar73);
          pvVar38 = (void *)(lVar65 * (uVar51 + 1) + (long)pvVar73);
          pvVar8 = weight_hc->data;
          local_258 = (void *)(lVar76 * uVar50 + (long)pvVar8);
          local_260 = (void *)(lVar76 * uVar41 + (long)pvVar8);
          local_290 = (void *)(lVar76 * uVar51 + (long)pvVar8);
          local_268 = (void *)(lVar76 * (uVar50 + 1) + (long)pvVar8);
          pvVar70 = (void *)(lVar76 * (uVar41 + 1) + (long)pvVar8);
          pvVar63 = (void *)(lVar76 * (uVar51 + 1) + (long)pvVar8);
          lVar55 = lVar65 * 2;
          local_270 = (void *)((long)pvVar73 + lVar65);
          lVar33 = lVar76 * 2;
          pvVar77 = (void *)(lVar76 + (long)pvVar8);
          uVar40 = 0;
          pvVar43 = pvVar8;
          local_168 = pvVar73;
          do {
            uVar68 = uVar40 | 1;
            lVar60 = uVar50 + uVar40 + 1;
            lVar39 = uVar41 + uVar40 + 1;
            lVar71 = uVar40 + uVar51 + 1;
            if (iVar54 < 1) {
              local_170 = (void *)(lVar65 * uVar40 + (long)pvVar73);
              local_178 = (void *)(lVar65 * (uVar40 + uVar50) + (long)pvVar73);
              local_180 = (void *)(lVar65 * (uVar40 + uVar41) + (long)pvVar73);
              pvVar34 = (void *)(lVar65 * (uVar40 + uVar51) + (long)pvVar73);
              pvVar44 = (void *)(lVar65 * uVar68 + (long)pvVar73);
              pvVar42 = (void *)(lVar65 * lVar60 + (long)pvVar73);
              pvVar61 = (void *)(lVar65 * lVar39 + (long)pvVar73);
              pvVar79 = (void *)(lVar65 * lVar71 + (long)pvVar73);
              auVar87 = ZEXT864(0);
              auVar102 = ZEXT864(0);
              auVar124 = ZEXT864(0);
              auVar130 = ZEXT864(0);
              auVar139 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar149 = ZEXT864(0);
              auVar113 = ZEXT864(0);
              pvVar49 = pvVar46;
            }
            else {
              auVar113 = ZEXT864(0);
              lVar78 = 0;
              auVar149 = ZEXT864(0);
              in_ZMM6 = ZEXT864(0);
              auVar139 = ZEXT864(0);
              auVar130 = ZEXT864(0);
              auVar124 = ZEXT864(0);
              auVar102 = ZEXT864(0);
              auVar87 = ZEXT864(0);
              uVar28 = iVar54 + 1U;
              do {
                pfVar3 = (float *)((long)pvVar46 + lVar78);
                fVar125 = *pfVar3;
                fVar135 = pfVar3[1];
                fVar131 = pfVar3[2];
                fVar140 = pfVar3[3];
                fVar132 = pfVar3[4];
                fVar141 = pfVar3[5];
                fVar133 = pfVar3[6];
                pfVar4 = (float *)((long)local_168 + lVar78);
                fVar134 = in_ZMM9._28_4_;
                auVar87 = ZEXT3264(CONCAT428(fVar134 + auVar87._28_4_,
                                             CONCAT424(fVar133 * pfVar4[6] + auVar87._24_4_,
                                                       CONCAT420(fVar141 * pfVar4[5] +
                                                                 auVar87._20_4_,
                                                                 CONCAT416(fVar132 * pfVar4[4] +
                                                                           auVar87._16_4_,
                                                                           CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar87._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar87._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar87._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar87._0_4_))))))));
                pfVar4 = (float *)((long)local_250 + lVar78);
                pfVar5 = (float *)((long)pvVar48 + lVar78);
                auVar102 = ZEXT3264(CONCAT428(fVar134 + auVar102._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar102._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar102._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar102._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar102._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar102._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar102._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar102._0_4_))))))));
                fVar152 = in_ZMM10._28_4_;
                auVar124 = ZEXT3264(CONCAT428(fVar152 + auVar124._28_4_,
                                              CONCAT424(fVar133 * pfVar5[6] + auVar124._24_4_,
                                                        CONCAT420(fVar141 * pfVar5[5] +
                                                                  auVar124._20_4_,
                                                                  CONCAT416(fVar132 * pfVar5[4] +
                                                                            auVar124._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar5[3] + auVar124._12_4_,
                                                  CONCAT48(fVar131 * pfVar5[2] + auVar124._8_4_,
                                                           CONCAT44(fVar135 * pfVar5[1] +
                                                                    auVar124._4_4_,
                                                                    fVar125 * *pfVar5 +
                                                                    auVar124._0_4_))))))));
                pfVar4 = (float *)((long)pvVar69 + lVar78);
                auVar130 = ZEXT3264(CONCAT428(fVar134 + auVar130._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar130._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar130._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar130._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar130._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar130._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar130._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar130._0_4_))))))));
                pfVar4 = (float *)((long)local_270 + lVar78);
                auVar139 = ZEXT3264(CONCAT428(fVar134 + auVar139._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar139._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar139._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar139._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar139._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar139._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar139._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar139._0_4_))))))));
                pfVar4 = (float *)((long)pvVar58 + lVar78);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar133 * pfVar4[6],
                                                               CONCAT420(fVar141 * pfVar4[5],
                                                                         CONCAT416(fVar132 * pfVar4[
                                                  4],CONCAT412(fVar140 * pfVar4[3],
                                                               CONCAT48(fVar131 * pfVar4[2],
                                                                        CONCAT44(fVar135 * pfVar4[1]
                                                                                 ,fVar125 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar52 + lVar78);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar133 * pfVar5[6],
                                                                CONCAT420(fVar141 * pfVar5[5],
                                                                          CONCAT416(fVar132 * pfVar5
                                                  [4],CONCAT412(fVar140 * pfVar5[3],
                                                                CONCAT48(fVar131 * pfVar5[2],
                                                                         CONCAT44(fVar135 * pfVar5[1
                                                  ],fVar125 * *pfVar5))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar134 + in_ZMM6._28_4_,
                                             CONCAT424(fVar133 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar141 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar132 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar140 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar149 = ZEXT3264(CONCAT428(fVar152 + auVar149._28_4_,
                                              CONCAT424(fVar133 * pfVar5[6] + auVar149._24_4_,
                                                        CONCAT420(fVar141 * pfVar5[5] +
                                                                  auVar149._20_4_,
                                                                  CONCAT416(fVar132 * pfVar5[4] +
                                                                            auVar149._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar5[3] + auVar149._12_4_,
                                                  CONCAT48(fVar131 * pfVar5[2] + auVar149._8_4_,
                                                           CONCAT44(fVar135 * pfVar5[1] +
                                                                    auVar149._4_4_,
                                                                    fVar125 * *pfVar5 +
                                                                    auVar149._0_4_))))))));
                pfVar4 = (float *)((long)pvVar38 + lVar78);
                auVar113 = ZEXT3264(CONCAT428(pfVar3[7] + auVar113._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar113._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar113._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar113._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar113._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar113._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar113._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar113._0_4_))))))));
                lVar78 = lVar78 + 0x20;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
              local_170 = (void *)((long)local_168 + lVar78);
              local_178 = (void *)((long)local_250 + lVar78);
              local_180 = (void *)((long)pvVar48 + lVar78);
              pvVar34 = (void *)((long)pvVar69 + lVar78);
              pvVar44 = (void *)((long)local_270 + lVar78);
              pvVar42 = (void *)((long)pvVar58 + lVar78);
              pvVar61 = (void *)((long)pvVar52 + lVar78);
              pvVar79 = (void *)(lVar78 + (long)pvVar38);
              pvVar49 = (void *)((long)pvVar46 + lVar78);
            }
            auVar127 = auVar130._0_32_;
            auVar148 = auVar149._0_32_;
            auVar95 = auVar102._0_32_;
            auVar81 = auVar87._0_32_;
            auVar116 = auVar124._0_32_;
            auVar136 = auVar139._0_32_;
            auVar105 = auVar113._0_32_;
            if (iVar57 < 1) {
              local_188 = (void *)(lVar76 * uVar40 + (long)pvVar8);
              local_2f0 = (void *)((uVar40 + uVar50) * lVar76 + (long)pvVar8);
              pvVar66 = (void *)((uVar40 + uVar41) * lVar76 + (long)pvVar8);
              local_2d0 = (void *)((uVar40 + uVar51) * lVar76 + (long)pvVar8);
              pvVar67 = (void *)(lVar76 * uVar68 + (long)pvVar8);
              local_2b0 = (void *)(lVar60 * lVar76 + (long)pvVar8);
              local_2d8 = (void *)(lVar39 * lVar76 + (long)pvVar8);
              pvVar72 = (void *)(lVar71 * lVar76 + (long)pvVar8);
              pvVar64 = local_2e0;
            }
            else {
              lVar39 = 0;
              uVar28 = uVar26;
              do {
                pfVar3 = (float *)((long)local_2e0 + lVar39);
                fVar125 = *pfVar3;
                fVar135 = pfVar3[1];
                fVar131 = pfVar3[2];
                fVar140 = pfVar3[3];
                fVar132 = pfVar3[4];
                fVar141 = pfVar3[5];
                fVar133 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar43 + lVar39);
                auVar81._0_4_ = fVar125 * *pfVar4 + auVar87._0_4_;
                auVar81._4_4_ = fVar135 * pfVar4[1] + auVar87._4_4_;
                auVar81._8_4_ = fVar131 * pfVar4[2] + auVar87._8_4_;
                auVar81._12_4_ = fVar140 * pfVar4[3] + auVar87._12_4_;
                auVar81._16_4_ = fVar132 * pfVar4[4] + auVar87._16_4_;
                auVar81._20_4_ = fVar141 * pfVar4[5] + auVar87._20_4_;
                auVar81._24_4_ = fVar133 * pfVar4[6] + auVar87._24_4_;
                fVar134 = in_ZMM9._28_4_;
                auVar81._28_4_ = fVar134 + auVar87._28_4_;
                auVar87 = ZEXT3264(auVar81);
                pfVar4 = (float *)((long)local_258 + lVar39);
                pfVar5 = (float *)((long)local_260 + lVar39);
                auVar95._0_4_ = fVar125 * *pfVar4 + auVar102._0_4_;
                auVar95._4_4_ = fVar135 * pfVar4[1] + auVar102._4_4_;
                auVar95._8_4_ = fVar131 * pfVar4[2] + auVar102._8_4_;
                auVar95._12_4_ = fVar140 * pfVar4[3] + auVar102._12_4_;
                auVar95._16_4_ = fVar132 * pfVar4[4] + auVar102._16_4_;
                auVar95._20_4_ = fVar141 * pfVar4[5] + auVar102._20_4_;
                auVar95._24_4_ = fVar133 * pfVar4[6] + auVar102._24_4_;
                auVar95._28_4_ = fVar134 + auVar102._28_4_;
                auVar102 = ZEXT3264(auVar95);
                auVar116._0_4_ = fVar125 * *pfVar5 + auVar124._0_4_;
                auVar116._4_4_ = fVar135 * pfVar5[1] + auVar124._4_4_;
                auVar116._8_4_ = fVar131 * pfVar5[2] + auVar124._8_4_;
                auVar116._12_4_ = fVar140 * pfVar5[3] + auVar124._12_4_;
                auVar116._16_4_ = fVar132 * pfVar5[4] + auVar124._16_4_;
                auVar116._20_4_ = fVar141 * pfVar5[5] + auVar124._20_4_;
                auVar116._24_4_ = fVar133 * pfVar5[6] + auVar124._24_4_;
                fVar152 = in_ZMM10._28_4_;
                auVar116._28_4_ = fVar152 + auVar124._28_4_;
                auVar124 = ZEXT3264(auVar116);
                pfVar4 = (float *)((long)local_290 + lVar39);
                auVar127._0_4_ = fVar125 * *pfVar4 + auVar130._0_4_;
                auVar127._4_4_ = fVar135 * pfVar4[1] + auVar130._4_4_;
                auVar127._8_4_ = fVar131 * pfVar4[2] + auVar130._8_4_;
                auVar127._12_4_ = fVar140 * pfVar4[3] + auVar130._12_4_;
                auVar127._16_4_ = fVar132 * pfVar4[4] + auVar130._16_4_;
                auVar127._20_4_ = fVar141 * pfVar4[5] + auVar130._20_4_;
                auVar127._24_4_ = fVar133 * pfVar4[6] + auVar130._24_4_;
                auVar127._28_4_ = fVar134 + auVar130._28_4_;
                auVar130 = ZEXT3264(auVar127);
                pfVar4 = (float *)((long)pvVar77 + lVar39);
                auVar136._0_4_ = fVar125 * *pfVar4 + auVar139._0_4_;
                auVar136._4_4_ = fVar135 * pfVar4[1] + auVar139._4_4_;
                auVar136._8_4_ = fVar131 * pfVar4[2] + auVar139._8_4_;
                auVar136._12_4_ = fVar140 * pfVar4[3] + auVar139._12_4_;
                auVar136._16_4_ = fVar132 * pfVar4[4] + auVar139._16_4_;
                auVar136._20_4_ = fVar141 * pfVar4[5] + auVar139._20_4_;
                auVar136._24_4_ = fVar133 * pfVar4[6] + auVar139._24_4_;
                auVar136._28_4_ = fVar134 + auVar139._28_4_;
                auVar139 = ZEXT3264(auVar136);
                pfVar4 = (float *)((long)local_268 + lVar39);
                in_ZMM9 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar133 * pfVar4[6],
                                                               CONCAT420(fVar141 * pfVar4[5],
                                                                         CONCAT416(fVar132 * pfVar4[
                                                  4],CONCAT412(fVar140 * pfVar4[3],
                                                               CONCAT48(fVar131 * pfVar4[2],
                                                                        CONCAT44(fVar135 * pfVar4[1]
                                                                                 ,fVar125 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar70 + lVar39);
                in_ZMM10 = ZEXT3264(CONCAT428(fVar152,CONCAT424(fVar133 * pfVar5[6],
                                                                CONCAT420(fVar141 * pfVar5[5],
                                                                          CONCAT416(fVar132 * pfVar5
                                                  [4],CONCAT412(fVar140 * pfVar5[3],
                                                                CONCAT48(fVar131 * pfVar5[2],
                                                                         CONCAT44(fVar135 * pfVar5[1
                                                  ],fVar125 * *pfVar5))))))));
                in_ZMM6 = ZEXT3264(CONCAT428(fVar134 + in_ZMM6._28_4_,
                                             CONCAT424(fVar133 * pfVar4[6] + in_ZMM6._24_4_,
                                                       CONCAT420(fVar141 * pfVar4[5] +
                                                                 in_ZMM6._20_4_,
                                                                 CONCAT416(fVar132 * pfVar4[4] +
                                                                           in_ZMM6._16_4_,
                                                                           CONCAT412(fVar140 * 
                                                  pfVar4[3] + in_ZMM6._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + in_ZMM6._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    in_ZMM6._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    in_ZMM6._0_4_))))))));
                auVar148._0_4_ = fVar125 * *pfVar5 + auVar149._0_4_;
                auVar148._4_4_ = fVar135 * pfVar5[1] + auVar149._4_4_;
                auVar148._8_4_ = fVar131 * pfVar5[2] + auVar149._8_4_;
                auVar148._12_4_ = fVar140 * pfVar5[3] + auVar149._12_4_;
                auVar148._16_4_ = fVar132 * pfVar5[4] + auVar149._16_4_;
                auVar148._20_4_ = fVar141 * pfVar5[5] + auVar149._20_4_;
                auVar148._24_4_ = fVar133 * pfVar5[6] + auVar149._24_4_;
                auVar148._28_4_ = fVar152 + auVar149._28_4_;
                auVar149 = ZEXT3264(auVar148);
                pfVar4 = (float *)((long)pvVar63 + lVar39);
                auVar105._0_4_ = fVar125 * *pfVar4 + auVar113._0_4_;
                auVar105._4_4_ = fVar135 * pfVar4[1] + auVar113._4_4_;
                auVar105._8_4_ = fVar131 * pfVar4[2] + auVar113._8_4_;
                auVar105._12_4_ = fVar140 * pfVar4[3] + auVar113._12_4_;
                auVar105._16_4_ = fVar132 * pfVar4[4] + auVar113._16_4_;
                auVar105._20_4_ = fVar141 * pfVar4[5] + auVar113._20_4_;
                auVar105._24_4_ = fVar133 * pfVar4[6] + auVar113._24_4_;
                auVar105._28_4_ = pfVar3[7] + auVar113._28_4_;
                auVar113 = ZEXT3264(auVar105);
                lVar39 = lVar39 + 0x20;
                uVar28 = uVar28 - 1;
              } while (1 < uVar28);
              local_188 = (void *)((long)pvVar43 + lVar39);
              local_2f0 = (void *)((long)local_258 + lVar39);
              pvVar66 = (void *)((long)local_260 + lVar39);
              local_2d0 = (void *)((long)local_290 + lVar39);
              pvVar67 = (void *)((long)pvVar77 + lVar39);
              local_2b0 = (void *)((long)local_268 + lVar39);
              local_2d8 = (void *)((long)pvVar70 + lVar39);
              pvVar72 = (void *)(lVar39 + (long)pvVar63);
              pvVar64 = (void *)((long)local_2e0 + lVar39);
            }
            auVar105 = vhaddps_avx(auVar148,auVar105);
            auVar136 = vhaddps_avx(auVar136,in_ZMM6._0_32_);
            in_ZMM5 = ZEXT3264(auVar136);
            auVar105 = vhaddps_avx(auVar136,auVar105);
            auVar116 = vhaddps_avx(auVar116,auVar127);
            auVar81 = vhaddps_avx(auVar81,auVar95);
            auVar95 = vhaddps_avx(auVar81,auVar116);
            auVar81 = vblendps_avx(auVar95,auVar105,0xf0);
            auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar47 + uVar68 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar47 + uVar68 * 4 + lVar31)),0x10);
            auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar47 +
                                                             uVar68 * 4 + lVar31 * 2)),0x20);
            auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar47 +
                                                             uVar68 * 4 + lVar31 * 3)),0x30);
            in_ZMM3 = ZEXT1664(auVar94);
            auVar95 = vperm2f128_avx(auVar95,auVar105,0x21);
            auVar150 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar47 + uVar40 * 4)),
                                     ZEXT416(*(uint *)((long)pvVar47 + uVar40 * 4 + lVar31)),0x10);
            auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)pvVar47 +
                                                               uVar40 * 4 + lVar31 * 2)),0x20);
            auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)pvVar47 +
                                                               uVar40 * 4 + lVar31 * 3)),0x30);
            auVar87 = ZEXT3264(CONCAT428(auVar81._28_4_ + auVar95._28_4_ + auVar94._12_4_,
                                         CONCAT424(auVar81._24_4_ + auVar95._24_4_ + auVar94._8_4_,
                                                   CONCAT420(auVar81._20_4_ + auVar95._20_4_ +
                                                             auVar94._4_4_,
                                                             CONCAT416(auVar81._16_4_ +
                                                                       auVar95._16_4_ +
                                                                       auVar94._0_4_,
                                                                       CONCAT412(auVar81._12_4_ +
                                                                                 auVar95._12_4_ +
                                                                                 auVar150._12_4_,
                                                                                 CONCAT48(auVar81.
                                                  _8_4_ + auVar95._8_4_ + auVar150._8_4_,
                                                  CONCAT44(auVar81._4_4_ + auVar95._4_4_ +
                                                           auVar150._4_4_,
                                                           auVar81._0_4_ + auVar95._0_4_ +
                                                           auVar150._0_4_))))))));
            if (uVar75 != 0) {
              lVar39 = 0;
              iVar35 = uVar75 + 1;
              do {
                auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar44 + lVar39)),
                                        ZEXT416(*(uint *)((long)pvVar42 + lVar39)),0x10);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar61 + lVar39)),0x20);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar79 + lVar39)),0x30);
                auVar150 = vinsertps_avx(ZEXT416(*(uint *)((long)local_170 + lVar39)),
                                         ZEXT416(*(uint *)((long)local_178 + lVar39)),0x10);
                auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)local_180 + lVar39)),0x20)
                ;
                auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)pvVar34 + lVar39)),0x30);
                fVar125 = *(float *)((long)pvVar49 + lVar39);
                auVar87 = ZEXT3264(CONCAT428(auVar94._12_4_ + auVar87._28_4_,
                                             CONCAT424(auVar94._8_4_ * fVar125 + auVar87._24_4_,
                                                       CONCAT420(auVar94._4_4_ * fVar125 +
                                                                 auVar87._20_4_,
                                                                 CONCAT416(auVar94._0_4_ * fVar125 +
                                                                           auVar87._16_4_,
                                                                           CONCAT412(auVar150._12_4_
                                                                                     * fVar125 +
                                                                                     auVar87._12_4_,
                                                                                     CONCAT48(
                                                  auVar150._8_4_ * fVar125 + auVar87._8_4_,
                                                  CONCAT44(auVar150._4_4_ * fVar125 + auVar87._4_4_,
                                                           auVar150._0_4_ * fVar125 + auVar87._0_4_)
                                                  )))))));
                lVar39 = lVar39 + 4;
                iVar35 = iVar35 + -1;
              } while (1 < iVar35);
            }
            auVar82 = auVar87._0_32_;
            if (uVar59 != 0) {
              lVar39 = 0;
              iVar35 = iVar27;
              do {
                auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar39)),
                                        ZEXT416(*(uint *)((long)local_2b0 + lVar39)),0x10);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)local_2d8 + lVar39)),0x20);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar72 + lVar39)),0x30);
                auVar150 = vinsertps_avx(ZEXT416(*(uint *)((long)local_188 + lVar39)),
                                         ZEXT416(*(uint *)((long)local_2f0 + lVar39)),0x10);
                auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)pvVar66 + lVar39)),0x20);
                auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)((long)local_2d0 + lVar39)),0x30)
                ;
                fVar125 = *(float *)((long)pvVar64 + lVar39);
                auVar82._0_4_ = auVar150._0_4_ * fVar125 + auVar87._0_4_;
                auVar82._4_4_ = auVar150._4_4_ * fVar125 + auVar87._4_4_;
                auVar82._8_4_ = auVar150._8_4_ * fVar125 + auVar87._8_4_;
                auVar82._12_4_ = auVar150._12_4_ * fVar125 + auVar87._12_4_;
                auVar82._16_4_ = auVar94._0_4_ * fVar125 + auVar87._16_4_;
                auVar82._20_4_ = auVar94._4_4_ * fVar125 + auVar87._20_4_;
                auVar82._24_4_ = auVar94._8_4_ * fVar125 + auVar87._24_4_;
                auVar82._28_4_ = auVar94._12_4_ + auVar87._28_4_;
                auVar87 = ZEXT3264(auVar82);
                lVar39 = lVar39 + 4;
                iVar35 = iVar35 + -1;
              } while (1 < iVar35);
            }
            *(int *)((long)local_78.data + uVar40 * 4) = auVar82._0_4_;
            auVar94 = auVar82._0_16_;
            uVar7 = vextractps_avx(auVar94,1);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar32) = uVar7;
            uVar7 = vextractps_avx(auVar94,2);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar32 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar94,3);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar32 * 3) = uVar7;
            auVar94 = auVar82._16_16_;
            *(int *)((long)local_78.data + uVar68 * 4) = auVar82._16_4_;
            uVar7 = vextractps_avx(auVar94,1);
            *(undefined4 *)((long)local_78.data + uVar68 * 4 + lVar32) = uVar7;
            uVar7 = vextractps_avx(auVar94,2);
            *(undefined4 *)((long)local_78.data + uVar68 * 4 + lVar32 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar94,3);
            *(undefined4 *)((long)local_78.data + uVar68 * 4 + lVar32 * 3) = uVar7;
            lVar39 = uVar40 + 3;
            local_168 = (void *)((long)local_168 + lVar55);
            local_250 = (void *)((long)local_250 + lVar55);
            pvVar48 = (void *)((long)pvVar48 + lVar55);
            pvVar69 = (void *)((long)pvVar69 + lVar55);
            local_270 = (void *)((long)local_270 + lVar55);
            pvVar58 = (void *)((long)pvVar58 + lVar55);
            pvVar52 = (void *)((long)pvVar52 + lVar55);
            pvVar38 = (void *)((long)pvVar38 + lVar55);
            pvVar43 = (void *)((long)pvVar43 + lVar33);
            local_258 = (void *)((long)local_258 + lVar33);
            local_260 = (void *)((long)local_260 + lVar33);
            local_290 = (void *)((long)local_290 + lVar33);
            pvVar77 = (void *)((long)pvVar77 + lVar33);
            local_268 = (void *)((long)local_268 + lVar33);
            pvVar70 = (void *)((long)pvVar70 + lVar33);
            pvVar63 = (void *)((long)pvVar63 + lVar33);
            uVar40 = uVar40 + 2;
          } while (lVar39 < (long)uVar74);
        }
        auVar147._8_4_ = 0x3f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        auVar147._12_4_ = 0x3f800000;
        auVar147._16_4_ = 0x3f800000;
        auVar147._20_4_ = 0x3f800000;
        auVar147._24_4_ = 0x3f800000;
        auVar147._28_4_ = 0x3f800000;
        if ((uint)uVar37 == _w) {
          lVar55 = local_78.elemsize * lVar30 * 3;
        }
        else {
          pvVar46 = (void *)((long)bottom_blob->w * (long)(int)uVar36 * bottom_blob->elemsize +
                            (long)bottom_blob->data);
          lVar33 = (long)bias_c->w * bias_c->elemsize;
          pvVar47 = bias_c->data;
          lVar32 = local_78.elemsize * lVar30;
          pvVar73 = weight_xc->data;
          lVar31 = (long)weight_xc->w * weight_xc->elemsize;
          pvVar8 = weight_hc->data;
          lVar65 = (long)weight_hc->w * weight_hc->elemsize;
          pvVar63 = (void *)(lVar31 * lVar1 + (long)pvVar73);
          pvVar38 = (void *)(lVar31 * lVar2 + (long)pvVar73);
          pvVar58 = (void *)(lVar31 * (uVar74 + uVar37) + (long)pvVar73);
          pvVar43 = (void *)(lVar31 * uVar37 + (long)pvVar73);
          local_2d0 = (void *)(lVar65 * lVar1 + (long)pvVar8);
          pvVar48 = (void *)(lVar65 * lVar2 + (long)pvVar8);
          pvVar52 = (void *)(lVar65 * (uVar74 + uVar37) + (long)pvVar8);
          pvVar69 = (void *)(lVar65 * uVar37 + (long)pvVar8);
          lVar55 = lVar32 * 3;
          uVar40 = uVar37;
          do {
            lVar76 = uVar40 + (long)(int)uVar24;
            lVar39 = uVar40 + (long)(int)uVar11;
            if (iVar54 < 1) {
              pvVar44 = (void *)(lVar31 * uVar40 + (long)pvVar73);
              pvVar34 = (void *)(lVar31 * (uVar40 + uVar74) + (long)pvVar73);
              pvVar77 = (void *)(lVar31 * lVar76 + (long)pvVar73);
              pvVar70 = (void *)(lVar31 * lVar39 + (long)pvVar73);
              auVar102 = ZEXT864(0);
              auVar113 = ZEXT864(0);
              in_ZMM3 = ZEXT864(0);
              auVar87 = ZEXT864(0);
              pvVar42 = pvVar46;
            }
            else {
              auVar87 = ZEXT864(0);
              lVar60 = 0;
              in_ZMM3 = ZEXT864(0);
              auVar113 = ZEXT864(0);
              auVar102 = ZEXT864(0);
              auVar124 = in_ZMM6;
              uVar28 = iVar54 + 1U;
              do {
                pfVar3 = (float *)((long)pvVar46 + lVar60);
                fVar125 = *pfVar3;
                fVar135 = pfVar3[1];
                fVar131 = pfVar3[2];
                fVar140 = pfVar3[3];
                fVar132 = pfVar3[4];
                fVar141 = pfVar3[5];
                fVar133 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar43 + lVar60);
                fVar134 = in_ZMM5._28_4_;
                auVar102 = ZEXT3264(CONCAT428(fVar134 + auVar102._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar102._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar102._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar102._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar102._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar102._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar102._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar102._0_4_))))))));
                pfVar4 = (float *)((long)pvVar58 + lVar60);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar133 * pfVar4[6],
                                                               CONCAT420(fVar141 * pfVar4[5],
                                                                         CONCAT416(fVar132 * pfVar4[
                                                  4],CONCAT412(fVar140 * pfVar4[3],
                                                               CONCAT48(fVar131 * pfVar4[2],
                                                                        CONCAT44(fVar135 * pfVar4[1]
                                                                                 ,fVar125 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar38 + lVar60);
                auVar130._0_4_ = fVar125 * *pfVar5;
                auVar130._4_4_ = fVar135 * pfVar5[1];
                auVar130._8_4_ = fVar131 * pfVar5[2];
                auVar130._12_4_ = fVar140 * pfVar5[3];
                auVar130._16_4_ = fVar132 * pfVar5[4];
                auVar130._20_4_ = fVar141 * pfVar5[5];
                auVar130._28_36_ = auVar124._28_36_;
                auVar130._24_4_ = fVar133 * pfVar5[6];
                in_ZMM6 = ZEXT3264(auVar130._0_32_);
                auVar113 = ZEXT3264(CONCAT428(fVar134 + auVar113._28_4_,
                                              CONCAT424(fVar133 * pfVar4[6] + auVar113._24_4_,
                                                        CONCAT420(fVar141 * pfVar4[5] +
                                                                  auVar113._20_4_,
                                                                  CONCAT416(fVar132 * pfVar4[4] +
                                                                            auVar113._16_4_,
                                                                            CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar113._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar113._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar113._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar113._0_4_))))))));
                in_ZMM3 = ZEXT3264(CONCAT428(auVar124._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar130._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar130._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar130._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar130._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar130._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar130._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar130._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)pvVar63 + lVar60);
                auVar87 = ZEXT3264(CONCAT428(pfVar3[7] + auVar87._28_4_,
                                             CONCAT424(fVar133 * pfVar4[6] + auVar87._24_4_,
                                                       CONCAT420(fVar141 * pfVar4[5] +
                                                                 auVar87._20_4_,
                                                                 CONCAT416(fVar132 * pfVar4[4] +
                                                                           auVar87._16_4_,
                                                                           CONCAT412(fVar140 * 
                                                  pfVar4[3] + auVar87._12_4_,
                                                  CONCAT48(fVar131 * pfVar4[2] + auVar87._8_4_,
                                                           CONCAT44(fVar135 * pfVar4[1] +
                                                                    auVar87._4_4_,
                                                                    fVar125 * *pfVar4 +
                                                                    auVar87._0_4_))))))));
                uVar28 = uVar28 - 1;
                lVar60 = lVar60 + 0x20;
                auVar124 = in_ZMM6;
              } while (1 < uVar28);
              pvVar70 = (void *)(lVar60 + (long)pvVar63);
              pvVar77 = (void *)((long)pvVar38 + lVar60);
              pvVar34 = (void *)((long)pvVar58 + lVar60);
              pvVar44 = (void *)((long)pvVar43 + lVar60);
              pvVar42 = (void *)(lVar60 + (long)pvVar46);
            }
            auVar106 = auVar113._0_32_;
            auVar96 = auVar102._0_32_;
            auVar83 = auVar87._0_32_;
            if (iVar57 < 1) {
              pvVar79 = (void *)(lVar65 * uVar40 + (long)pvVar8);
              pvVar49 = (void *)((uVar40 + uVar74) * lVar65 + (long)pvVar8);
              pvVar61 = (void *)(lVar76 * lVar65 + (long)pvVar8);
              pvVar67 = (void *)(lVar39 * lVar65 + (long)pvVar8);
              pvVar66 = local_2e0;
            }
            else {
              lVar76 = 0;
              auVar124 = in_ZMM6;
              uVar28 = uVar26;
              do {
                pfVar3 = (float *)((long)local_2e0 + lVar76);
                fVar125 = *pfVar3;
                fVar135 = pfVar3[1];
                fVar131 = pfVar3[2];
                fVar140 = pfVar3[3];
                fVar132 = pfVar3[4];
                fVar141 = pfVar3[5];
                fVar133 = pfVar3[6];
                pfVar4 = (float *)((long)pvVar69 + lVar76);
                auVar96._0_4_ = fVar125 * *pfVar4 + auVar102._0_4_;
                auVar96._4_4_ = fVar135 * pfVar4[1] + auVar102._4_4_;
                auVar96._8_4_ = fVar131 * pfVar4[2] + auVar102._8_4_;
                auVar96._12_4_ = fVar140 * pfVar4[3] + auVar102._12_4_;
                auVar96._16_4_ = fVar132 * pfVar4[4] + auVar102._16_4_;
                auVar96._20_4_ = fVar141 * pfVar4[5] + auVar102._20_4_;
                auVar96._24_4_ = fVar133 * pfVar4[6] + auVar102._24_4_;
                fVar134 = in_ZMM5._28_4_;
                auVar96._28_4_ = fVar134 + auVar102._28_4_;
                auVar102 = ZEXT3264(auVar96);
                pfVar4 = (float *)((long)pvVar52 + lVar76);
                in_ZMM5 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar133 * pfVar4[6],
                                                               CONCAT420(fVar141 * pfVar4[5],
                                                                         CONCAT416(fVar132 * pfVar4[
                                                  4],CONCAT412(fVar140 * pfVar4[3],
                                                               CONCAT48(fVar131 * pfVar4[2],
                                                                        CONCAT44(fVar135 * pfVar4[1]
                                                                                 ,fVar125 * *pfVar4)
                                                                       )))))));
                pfVar5 = (float *)((long)pvVar48 + lVar76);
                auVar139._0_4_ = fVar125 * *pfVar5;
                auVar139._4_4_ = fVar135 * pfVar5[1];
                auVar139._8_4_ = fVar131 * pfVar5[2];
                auVar139._12_4_ = fVar140 * pfVar5[3];
                auVar139._16_4_ = fVar132 * pfVar5[4];
                auVar139._20_4_ = fVar141 * pfVar5[5];
                auVar139._28_36_ = auVar124._28_36_;
                auVar139._24_4_ = fVar133 * pfVar5[6];
                in_ZMM6 = ZEXT3264(auVar139._0_32_);
                auVar106._0_4_ = fVar125 * *pfVar4 + auVar113._0_4_;
                auVar106._4_4_ = fVar135 * pfVar4[1] + auVar113._4_4_;
                auVar106._8_4_ = fVar131 * pfVar4[2] + auVar113._8_4_;
                auVar106._12_4_ = fVar140 * pfVar4[3] + auVar113._12_4_;
                auVar106._16_4_ = fVar132 * pfVar4[4] + auVar113._16_4_;
                auVar106._20_4_ = fVar141 * pfVar4[5] + auVar113._20_4_;
                auVar106._24_4_ = fVar133 * pfVar4[6] + auVar113._24_4_;
                auVar106._28_4_ = fVar134 + auVar113._28_4_;
                auVar113 = ZEXT3264(auVar106);
                in_ZMM3 = ZEXT3264(CONCAT428(auVar124._28_4_ + in_ZMM3._28_4_,
                                             CONCAT424(auVar139._24_4_ + in_ZMM3._24_4_,
                                                       CONCAT420(auVar139._20_4_ + in_ZMM3._20_4_,
                                                                 CONCAT416(auVar139._16_4_ +
                                                                           in_ZMM3._16_4_,
                                                                           CONCAT412(auVar139._12_4_
                                                                                     + in_ZMM3.
                                                  _12_4_,CONCAT48(auVar139._8_4_ + in_ZMM3._8_4_,
                                                                  CONCAT44(auVar139._4_4_ +
                                                                           in_ZMM3._4_4_,
                                                                           auVar139._0_4_ +
                                                                           in_ZMM3._0_4_))))))));
                pfVar4 = (float *)((long)local_2d0 + lVar76);
                auVar83._0_4_ = fVar125 * *pfVar4 + auVar87._0_4_;
                auVar83._4_4_ = fVar135 * pfVar4[1] + auVar87._4_4_;
                auVar83._8_4_ = fVar131 * pfVar4[2] + auVar87._8_4_;
                auVar83._12_4_ = fVar140 * pfVar4[3] + auVar87._12_4_;
                auVar83._16_4_ = fVar132 * pfVar4[4] + auVar87._16_4_;
                auVar83._20_4_ = fVar141 * pfVar4[5] + auVar87._20_4_;
                auVar83._24_4_ = fVar133 * pfVar4[6] + auVar87._24_4_;
                auVar83._28_4_ = pfVar3[7] + auVar87._28_4_;
                auVar87 = ZEXT3264(auVar83);
                uVar28 = uVar28 - 1;
                lVar76 = lVar76 + 0x20;
                auVar124 = in_ZMM6;
              } while (1 < uVar28);
              pvVar67 = (void *)((long)local_2d0 + lVar76);
              pvVar61 = (void *)((long)pvVar48 + lVar76);
              pvVar49 = (void *)((long)pvVar52 + lVar76);
              pvVar79 = (void *)((long)pvVar69 + lVar76);
              pvVar66 = (void *)(lVar76 + (long)local_2e0);
            }
            auVar81 = vhaddps_avx(in_ZMM3._0_32_,auVar83);
            auVar95 = vhaddps_avx(auVar96,auVar106);
            auVar81 = vhaddps_avx(auVar95,auVar81);
            auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar47 + uVar40 * 4)),
                                    ZEXT416(*(uint *)((long)pvVar47 + uVar40 * 4 + lVar33)),0x10);
            auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar47 +
                                                             uVar40 * 4 + lVar33 * 2)),0x20);
            auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar47 +
                                                             uVar40 * 4 + lVar33 * 3)),0x30);
            auVar87 = ZEXT1664(CONCAT412(auVar94._12_4_ + auVar81._12_4_ + auVar81._28_4_,
                                         CONCAT48(auVar94._8_4_ + auVar81._8_4_ + auVar81._24_4_,
                                                  CONCAT44(auVar94._4_4_ + auVar81._4_4_ +
                                                           auVar81._20_4_,
                                                           auVar94._0_4_ + auVar81._0_4_ +
                                                           auVar81._16_4_))));
            if (uVar75 != 0) {
              lVar76 = 0;
              iVar35 = uVar75 + 1;
              do {
                auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar44 + lVar76)),
                                        ZEXT416(*(uint *)((long)pvVar34 + lVar76)),0x10);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar77 + lVar76)),0x20);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar70 + lVar76)),0x30);
                fVar125 = *(float *)((long)pvVar42 + lVar76);
                auVar87 = ZEXT1664(CONCAT412(auVar94._12_4_ * fVar125 + auVar87._12_4_,
                                             CONCAT48(auVar94._8_4_ * fVar125 + auVar87._8_4_,
                                                      CONCAT44(auVar94._4_4_ * fVar125 +
                                                               auVar87._4_4_,
                                                               auVar94._0_4_ * fVar125 +
                                                               auVar87._0_4_))));
                iVar35 = iVar35 + -1;
                lVar76 = lVar76 + 4;
              } while (1 < iVar35);
            }
            auVar94 = auVar87._0_16_;
            if (uVar59 != 0) {
              lVar76 = 0;
              iVar35 = iVar27;
              do {
                auVar94 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar79 + lVar76)),
                                        ZEXT416(*(uint *)((long)pvVar49 + lVar76)),0x10);
                auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar61 + lVar76)),0x20);
                auVar150 = vinsertps_avx(auVar94,ZEXT416(*(uint *)((long)pvVar67 + lVar76)),0x30);
                fVar125 = *(float *)((long)pvVar66 + lVar76);
                auVar94._0_4_ = auVar150._0_4_ * fVar125 + auVar87._0_4_;
                auVar94._4_4_ = auVar150._4_4_ * fVar125 + auVar87._4_4_;
                auVar94._8_4_ = auVar150._8_4_ * fVar125 + auVar87._8_4_;
                auVar94._12_4_ = auVar150._12_4_ * fVar125 + auVar87._12_4_;
                auVar87 = ZEXT1664(auVar94);
                iVar35 = iVar35 + -1;
                lVar76 = lVar76 + 4;
              } while (1 < iVar35);
            }
            *(int *)((long)local_78.data + uVar40 * 4) = auVar94._0_4_;
            uVar7 = vextractps_avx(auVar94,1);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar32) = uVar7;
            uVar7 = vextractps_avx(auVar94,2);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar32 * 2) = uVar7;
            uVar7 = vextractps_avx(auVar94,3);
            *(undefined4 *)((long)local_78.data + uVar40 * 4 + lVar55) = uVar7;
            uVar40 = uVar40 + 1;
            pvVar63 = (void *)((long)pvVar63 + lVar31);
            pvVar38 = (void *)((long)pvVar38 + lVar31);
            pvVar58 = (void *)((long)pvVar58 + lVar31);
            pvVar43 = (void *)((long)pvVar43 + lVar31);
            local_2d0 = (void *)((long)local_2d0 + lVar65);
            pvVar48 = (void *)((long)pvVar48 + lVar65);
            pvVar52 = (void *)((long)pvVar52 + lVar65);
            pvVar69 = (void *)((long)pvVar69 + lVar65);
          } while ((long)uVar40 < (long)uVar74);
        }
        pvVar73 = (void *)((long)top_blob->w * (long)(int)uVar36 * top_blob->elemsize +
                          (long)top_blob->data);
        pAVar45 = (Allocator *)((long)local_78.data + local_78.elemsize * lVar30);
        pAVar53 = (Allocator *)((long)local_78.data + local_78.elemsize * lVar30 * 2);
        pAVar56 = (Allocator *)((long)local_78.data + lVar55);
        pvVar47 = cell_state->data;
        pAVar62 = (Allocator *)local_78.data;
        if (0 < iVar57) {
          lVar30 = 0;
          auVar150._8_4_ = 0x3f800000;
          auVar150._0_8_ = 0x3f8000003f800000;
          auVar150._12_4_ = 0x3f800000;
          in_ZMM9 = ZEXT1664(auVar150);
          uVar36 = uVar26;
          do {
            auVar81 = *(undefined1 (*) [32])((long)local_78.data + lVar30);
            auVar84._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar84._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar84._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar84._16_4_ = auVar81._16_4_ ^ 0x80000000;
            auVar84._20_4_ = auVar81._20_4_ ^ 0x80000000;
            auVar84._24_4_ = auVar81._24_4_ ^ 0x80000000;
            auVar84._28_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar151._8_4_ = 0x42b0c0a5;
            auVar151._0_8_ = 0x42b0c0a542b0c0a5;
            auVar151._12_4_ = 0x42b0c0a5;
            auVar151._16_4_ = 0x42b0c0a5;
            auVar151._20_4_ = 0x42b0c0a5;
            auVar151._24_4_ = 0x42b0c0a5;
            auVar151._28_4_ = 0x42b0c0a5;
            in_ZMM10 = ZEXT3264(auVar151);
            auVar81 = vminps_avx(auVar151,auVar84);
            auVar97._8_4_ = 0xc2b0c0a5;
            auVar97._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar97._12_4_ = 0xc2b0c0a5;
            auVar97._16_4_ = 0xc2b0c0a5;
            auVar97._20_4_ = 0xc2b0c0a5;
            auVar97._24_4_ = 0xc2b0c0a5;
            auVar97._28_4_ = 0xc2b0c0a5;
            auVar95 = vmaxps_avx(auVar81,auVar97);
            auVar98._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
            auVar98._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
            auVar98._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
            auVar98._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
            auVar98._16_4_ = auVar95._16_4_ * 1.442695 + 0.5;
            auVar98._20_4_ = auVar95._20_4_ * 1.442695 + 0.5;
            auVar98._24_4_ = auVar95._24_4_ * 1.442695 + 0.5;
            auVar98._28_4_ = 0xc2afc0a5;
            auVar105 = vroundps_avx(auVar98,1);
            auVar81 = vcmpps_avx(auVar98,auVar105,1);
            auVar81 = vandps_avx(auVar81,auVar147);
            auVar81 = vsubps_avx(auVar105,auVar81);
            auVar12._4_4_ = auVar81._4_4_ * 0.6931472;
            auVar12._0_4_ = auVar81._0_4_ * 0.6931472;
            auVar12._8_4_ = auVar81._8_4_ * 0.6931472;
            auVar12._12_4_ = auVar81._12_4_ * 0.6931472;
            auVar12._16_4_ = auVar81._16_4_ * 0.6931472;
            auVar12._20_4_ = auVar81._20_4_ * 0.6931472;
            auVar12._24_4_ = auVar81._24_4_ * 0.6931472;
            auVar12._28_4_ = auVar105._28_4_;
            auVar95 = vsubps_avx(auVar95,auVar12);
            fVar125 = auVar95._0_4_;
            fVar135 = auVar95._4_4_;
            fVar131 = auVar95._8_4_;
            fVar140 = auVar95._12_4_;
            fVar132 = auVar95._16_4_;
            fVar141 = auVar95._20_4_;
            fVar133 = auVar95._24_4_;
            auVar103._0_4_ = (int)auVar81._0_4_;
            auVar103._4_4_ = (int)auVar81._4_4_;
            auVar103._8_4_ = (int)auVar81._8_4_;
            auVar103._12_4_ = (int)auVar81._12_4_;
            auVar99._16_4_ = (int)auVar81._16_4_;
            auVar99._0_16_ = auVar103;
            auVar99._20_4_ = (int)auVar81._20_4_;
            auVar99._24_4_ = (int)auVar81._24_4_;
            auVar99._28_4_ = (int)auVar81._28_4_;
            auVar103 = vpslld_avx(auVar103,0x17);
            auVar94 = vpslld_avx(auVar99._16_16_,0x17);
            auVar94 = vpaddd_avx(auVar150,auVar94);
            auVar103 = vpaddd_avx(auVar150,auVar103);
            auVar107._0_4_ =
                 (fVar125 + 1.0 +
                 fVar125 * fVar125 *
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5)) * auVar103._0_4_ + 1.0;
            auVar107._4_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar103._4_4_ + 1.0;
            auVar107._8_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar103._8_4_ + 1.0;
            auVar107._12_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar103._12_4_ + 1.0;
            auVar107._16_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar94._0_4_ + 1.0;
            auVar107._20_4_ =
                 (fVar141 + 1.0 +
                 fVar141 * fVar141 *
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar94._4_4_ + 1.0;
            auVar107._24_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar94._8_4_ + 1.0;
            auVar107._28_4_ = auVar95._28_4_ + 1.0 + auVar105._28_4_ + 1.0;
            auVar105 = vrcpps_avx(auVar107);
            pAVar62 = pAVar56 + lVar30;
            auVar13._4_4_ = *(float *)(pAVar62 + 4) * -2.0;
            auVar13._0_4_ = *(float *)pAVar62 * -2.0;
            auVar13._8_4_ = *(float *)(pAVar62 + 8) * -2.0;
            auVar13._12_4_ = *(float *)(pAVar62 + 0xc) * -2.0;
            auVar13._16_4_ = *(float *)(pAVar62 + 0x10) * -2.0;
            auVar13._20_4_ = *(float *)(pAVar62 + 0x14) * -2.0;
            auVar13._24_4_ = *(float *)(pAVar62 + 0x18) * -2.0;
            auVar13._28_4_ = 0xc0000000;
            auVar81 = vminps_avx(auVar151,auVar13);
            auVar95 = vmaxps_avx(auVar81,auVar97);
            auVar117._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
            auVar117._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
            auVar117._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
            auVar117._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
            auVar117._16_4_ = auVar95._16_4_ * 1.442695 + 0.5;
            auVar117._20_4_ = auVar95._20_4_ * 1.442695 + 0.5;
            auVar117._24_4_ = auVar95._24_4_ * 1.442695 + 0.5;
            auVar117._28_4_ =
                 in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
            auVar116 = vroundps_avx(auVar117,1);
            auVar81 = vcmpps_avx(auVar117,auVar116,1);
            auVar81 = vandps_avx(auVar81,auVar147);
            auVar81 = vsubps_avx(auVar116,auVar81);
            auVar14._4_4_ = auVar81._4_4_ * 0.6931472;
            auVar14._0_4_ = auVar81._0_4_ * 0.6931472;
            auVar14._8_4_ = auVar81._8_4_ * 0.6931472;
            auVar14._12_4_ = auVar81._12_4_ * 0.6931472;
            auVar14._16_4_ = auVar81._16_4_ * 0.6931472;
            auVar14._20_4_ = auVar81._20_4_ * 0.6931472;
            auVar14._24_4_ = auVar81._24_4_ * 0.6931472;
            auVar14._28_4_ = auVar116._28_4_;
            auVar95 = vsubps_avx(auVar95,auVar14);
            fVar125 = auVar95._0_4_;
            fVar135 = auVar95._4_4_;
            fVar131 = auVar95._8_4_;
            fVar140 = auVar95._12_4_;
            fVar132 = auVar95._16_4_;
            fVar141 = auVar95._20_4_;
            fVar133 = auVar95._24_4_;
            auVar114._0_4_ = (int)auVar81._0_4_;
            auVar114._4_4_ = (int)auVar81._4_4_;
            auVar114._8_4_ = (int)auVar81._8_4_;
            auVar114._12_4_ = (int)auVar81._12_4_;
            auVar118._16_4_ = (int)auVar81._16_4_;
            auVar118._0_16_ = auVar114;
            auVar118._20_4_ = (int)auVar81._20_4_;
            auVar118._24_4_ = (int)auVar81._24_4_;
            auVar118._28_4_ = (int)auVar81._28_4_;
            auVar103 = vpslld_avx(auVar114,0x17);
            auVar94 = vpslld_avx(auVar118._16_16_,0x17);
            auVar94 = vpaddd_avx(auVar150,auVar94);
            auVar103 = vpaddd_avx(auVar150,auVar103);
            auVar85._0_4_ =
                 (fVar125 + 1.0 +
                 fVar125 * fVar125 *
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5)) * auVar103._0_4_ + 1.0;
            auVar85._4_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar103._4_4_ + 1.0;
            auVar85._8_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar103._8_4_ + 1.0;
            auVar85._12_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar103._12_4_ + 1.0;
            auVar85._16_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar94._0_4_ + 1.0;
            auVar85._20_4_ =
                 (fVar141 + 1.0 +
                 fVar141 * fVar141 *
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar94._4_4_ + 1.0;
            auVar85._24_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar94._8_4_ + 1.0;
            auVar85._28_4_ = auVar95._28_4_ + 1.0 + auVar116._28_4_ + 1.0;
            auVar81 = vrcpps_avx(auVar85);
            fVar125 = auVar81._0_4_;
            fVar135 = auVar81._4_4_;
            fVar131 = auVar81._8_4_;
            fVar140 = auVar81._12_4_;
            fVar132 = auVar81._16_4_;
            fVar141 = auVar81._20_4_;
            fVar133 = auVar81._24_4_;
            auVar15._4_4_ = auVar85._4_4_ * (fVar135 + fVar135);
            auVar15._0_4_ = auVar85._0_4_ * (fVar125 + fVar125);
            auVar15._8_4_ = auVar85._8_4_ * (fVar131 + fVar131);
            auVar15._12_4_ = auVar85._12_4_ * (fVar140 + fVar140);
            auVar15._16_4_ = auVar85._16_4_ * (fVar132 + fVar132);
            auVar15._20_4_ = auVar85._20_4_ * (fVar141 + fVar141);
            auVar15._24_4_ = auVar85._24_4_ * (fVar133 + fVar133);
            auVar15._28_4_ = auVar85._28_4_;
            auVar137._8_4_ = 0x40000000;
            auVar137._0_8_ = 0x4000000040000000;
            auVar137._12_4_ = 0x40000000;
            auVar137._16_4_ = 0x40000000;
            auVar137._20_4_ = 0x40000000;
            auVar137._24_4_ = 0x40000000;
            auVar137._28_4_ = 0x40000000;
            auVar95 = vsubps_avx(auVar137,auVar15);
            fVar134 = auVar95._28_4_;
            auVar119._0_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar95._0_4_;
            auVar119._4_4_ = fVar135 + fVar135 + -1.0 + fVar135 * auVar95._4_4_;
            auVar119._8_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar95._8_4_;
            auVar119._12_4_ = fVar140 + fVar140 + -1.0 + fVar140 * auVar95._12_4_;
            auVar119._16_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar95._16_4_;
            auVar119._20_4_ = fVar141 + fVar141 + -1.0 + fVar141 * auVar95._20_4_;
            auVar119._24_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar95._24_4_;
            auVar119._28_4_ = auVar81._28_4_ + auVar81._28_4_ + -1.0 + fVar134;
            fVar80 = auVar119._0_4_ * auVar105._0_4_;
            fVar88 = auVar119._4_4_ * auVar105._4_4_;
            fVar89 = auVar119._8_4_ * auVar105._8_4_;
            fVar90 = auVar119._12_4_ * auVar105._12_4_;
            fVar91 = auVar119._16_4_ * auVar105._16_4_;
            fVar92 = auVar119._20_4_ * auVar105._20_4_;
            fVar93 = auVar119._24_4_ * auVar105._24_4_;
            auVar16._4_4_ = auVar107._4_4_ * fVar88;
            auVar16._0_4_ = auVar107._0_4_ * fVar80;
            auVar16._8_4_ = auVar107._8_4_ * fVar89;
            auVar16._12_4_ = auVar107._12_4_ * fVar90;
            auVar16._16_4_ = auVar107._16_4_ * fVar91;
            auVar16._20_4_ = auVar107._20_4_ * fVar92;
            auVar16._24_4_ = auVar107._24_4_ * fVar93;
            auVar16._28_4_ = auVar107._28_4_;
            auVar136 = vsubps_avx(auVar119,auVar16);
            auVar81 = *(undefined1 (*) [32])(pAVar45 + lVar30);
            auVar108._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
            auVar108._8_4_ = auVar81._8_4_ ^ 0x80000000;
            auVar108._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar108._16_4_ = auVar81._16_4_ ^ 0x80000000;
            auVar108._20_4_ = auVar81._20_4_ ^ 0x80000000;
            auVar108._24_4_ = auVar81._24_4_ ^ 0x80000000;
            auVar108._28_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar81 = vminps_avx(auVar151,auVar108);
            auVar146._8_4_ = 0xc2b0c0a5;
            auVar146._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar146._12_4_ = 0xc2b0c0a5;
            auVar146._16_4_ = 0xc2b0c0a5;
            auVar146._20_4_ = 0xc2b0c0a5;
            auVar146._24_4_ = 0xc2b0c0a5;
            auVar146._28_4_ = 0xc2b0c0a5;
            auVar95 = vmaxps_avx(auVar81,auVar146);
            auVar120._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
            auVar120._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
            auVar120._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
            auVar120._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
            auVar120._16_4_ = auVar95._16_4_ * 1.442695 + 0.5;
            auVar120._20_4_ = auVar95._20_4_ * 1.442695 + 0.5;
            auVar120._24_4_ = auVar95._24_4_ * 1.442695 + 0.5;
            auVar120._28_4_ = auVar119._28_4_ + 0.5;
            auVar116 = vroundps_avx(auVar120,1);
            auVar81 = vcmpps_avx(auVar120,auVar116,1);
            auVar81 = vandps_avx(auVar81,auVar147);
            auVar81 = vsubps_avx(auVar116,auVar81);
            auVar17._4_4_ = auVar81._4_4_ * 0.6931472;
            auVar17._0_4_ = auVar81._0_4_ * 0.6931472;
            auVar17._8_4_ = auVar81._8_4_ * 0.6931472;
            auVar17._12_4_ = auVar81._12_4_ * 0.6931472;
            auVar17._16_4_ = auVar81._16_4_ * 0.6931472;
            auVar17._20_4_ = auVar81._20_4_ * 0.6931472;
            auVar17._24_4_ = auVar81._24_4_ * 0.6931472;
            auVar17._28_4_ = auVar116._28_4_;
            auVar95 = vsubps_avx(auVar95,auVar17);
            fVar125 = auVar95._0_4_;
            fVar135 = auVar95._4_4_;
            fVar131 = auVar95._8_4_;
            fVar140 = auVar95._12_4_;
            fVar132 = auVar95._16_4_;
            fVar141 = auVar95._20_4_;
            fVar133 = auVar95._24_4_;
            auVar115._0_4_ = (int)auVar81._0_4_;
            auVar115._4_4_ = (int)auVar81._4_4_;
            auVar115._8_4_ = (int)auVar81._8_4_;
            auVar115._12_4_ = (int)auVar81._12_4_;
            auVar121._16_4_ = (int)auVar81._16_4_;
            auVar121._0_16_ = auVar115;
            auVar121._20_4_ = (int)auVar81._20_4_;
            auVar121._24_4_ = (int)auVar81._24_4_;
            auVar121._28_4_ = (int)auVar81._28_4_;
            auVar103 = vpslld_avx(auVar115,0x17);
            auVar94 = vpslld_avx(auVar121._16_16_,0x17);
            auVar94 = vpaddd_avx(auVar150,auVar94);
            auVar103 = vpaddd_avx(auVar150,auVar103);
            auVar109._0_4_ =
                 (fVar125 + 1.0 +
                 fVar125 * fVar125 *
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5)) * auVar103._0_4_ + 1.0;
            auVar109._4_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar103._4_4_ + 1.0;
            auVar109._8_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar103._8_4_ + 1.0;
            auVar109._12_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar103._12_4_ + 1.0;
            auVar109._16_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar94._0_4_ + 1.0;
            auVar109._20_4_ =
                 (fVar141 + 1.0 +
                 fVar141 * fVar141 *
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar94._4_4_ + 1.0;
            auVar109._24_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar94._8_4_ + 1.0;
            auVar109._28_4_ = auVar95._28_4_ + 1.0 + auVar116._28_4_ + 1.0;
            auVar116 = vrcpps_avx(auVar109);
            auVar81 = *(undefined1 (*) [32])((long)pvVar47 + lVar30);
            fVar135 = auVar81._0_4_ * auVar116._0_4_;
            fVar140 = auVar81._4_4_ * auVar116._4_4_;
            fVar141 = auVar81._8_4_ * auVar116._8_4_;
            fVar142 = auVar81._12_4_ * auVar116._12_4_;
            fVar143 = auVar81._16_4_ * auVar116._16_4_;
            fVar144 = auVar81._20_4_ * auVar116._20_4_;
            fVar145 = auVar81._24_4_ * auVar116._24_4_;
            auVar18._4_4_ = auVar109._4_4_ * fVar140;
            auVar18._0_4_ = auVar109._0_4_ * fVar135;
            auVar18._8_4_ = auVar109._8_4_ * fVar141;
            auVar18._12_4_ = auVar109._12_4_ * fVar142;
            auVar18._16_4_ = auVar109._16_4_ * fVar143;
            auVar18._20_4_ = auVar109._20_4_ * fVar144;
            auVar18._24_4_ = auVar109._24_4_ * fVar145;
            auVar18._28_4_ = auVar109._28_4_;
            auVar148 = vsubps_avx(auVar81,auVar18);
            auVar95 = *(undefined1 (*) [32])(pAVar53 + lVar30);
            auVar122._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
            auVar122._8_4_ = auVar95._8_4_ ^ 0x80000000;
            auVar122._12_4_ = auVar95._12_4_ ^ 0x80000000;
            auVar122._16_4_ = auVar95._16_4_ ^ 0x80000000;
            auVar122._20_4_ = auVar95._20_4_ ^ 0x80000000;
            auVar122._24_4_ = auVar95._24_4_ ^ 0x80000000;
            auVar122._28_4_ = auVar95._28_4_ ^ 0x80000000;
            auVar95 = vminps_avx(auVar151,auVar122);
            auVar95 = vmaxps_avx(auVar95,auVar146);
            auVar128._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
            auVar128._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
            auVar128._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
            auVar128._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
            auVar128._16_4_ = auVar95._16_4_ * 1.442695 + 0.5;
            auVar128._20_4_ = auVar95._20_4_ * 1.442695 + 0.5;
            auVar128._24_4_ = auVar95._24_4_ * 1.442695 + 0.5;
            auVar128._28_4_ = auVar81._28_4_ + 0.5;
            auVar127 = vroundps_avx(auVar128,1);
            auVar81 = vcmpps_avx(auVar128,auVar127,1);
            auVar81 = vandps_avx(auVar81,auVar147);
            auVar81 = vsubps_avx(auVar127,auVar81);
            auVar19._4_4_ = auVar81._4_4_ * 0.6931472;
            auVar19._0_4_ = auVar81._0_4_ * 0.6931472;
            auVar19._8_4_ = auVar81._8_4_ * 0.6931472;
            auVar19._12_4_ = auVar81._12_4_ * 0.6931472;
            auVar19._16_4_ = auVar81._16_4_ * 0.6931472;
            auVar19._20_4_ = auVar81._20_4_ * 0.6931472;
            auVar19._24_4_ = auVar81._24_4_ * 0.6931472;
            auVar19._28_4_ = auVar127._28_4_;
            auVar82 = vsubps_avx(auVar95,auVar19);
            fVar125 = auVar82._0_4_;
            fVar131 = auVar82._4_4_;
            fVar132 = auVar82._8_4_;
            fVar133 = auVar82._12_4_;
            fVar152 = auVar82._16_4_;
            fVar9 = auVar82._20_4_;
            fVar10 = auVar82._24_4_;
            auVar126._0_4_ = (int)auVar81._0_4_;
            auVar126._4_4_ = (int)auVar81._4_4_;
            auVar126._8_4_ = (int)auVar81._8_4_;
            auVar126._12_4_ = (int)auVar81._12_4_;
            auVar129._16_4_ = (int)auVar81._16_4_;
            auVar129._0_16_ = auVar126;
            auVar129._20_4_ = (int)auVar81._20_4_;
            auVar129._24_4_ = (int)auVar81._24_4_;
            auVar129._28_4_ = (int)auVar81._28_4_;
            auVar103 = vpslld_avx(auVar126,0x17);
            auVar94 = vpslld_avx(auVar129._16_16_,0x17);
            auVar94 = vpaddd_avx(auVar150,auVar94);
            auVar103 = vpaddd_avx(auVar150,auVar103);
            auVar86._0_4_ =
                 fVar135 + auVar116._0_4_ * auVar148._0_4_ + fVar80 +
                 auVar105._0_4_ * auVar136._0_4_;
            auVar86._4_4_ =
                 fVar140 + auVar116._4_4_ * auVar148._4_4_ + fVar88 +
                 auVar105._4_4_ * auVar136._4_4_;
            auVar86._8_4_ =
                 fVar141 + auVar116._8_4_ * auVar148._8_4_ + fVar89 +
                 auVar105._8_4_ * auVar136._8_4_;
            auVar86._12_4_ =
                 fVar142 + auVar116._12_4_ * auVar148._12_4_ + fVar90 +
                 auVar105._12_4_ * auVar136._12_4_;
            auVar86._16_4_ =
                 fVar143 + auVar116._16_4_ * auVar148._16_4_ + fVar91 +
                 auVar105._16_4_ * auVar136._16_4_;
            auVar86._20_4_ =
                 fVar144 + auVar116._20_4_ * auVar148._20_4_ + fVar92 +
                 auVar105._20_4_ * auVar136._20_4_;
            auVar86._24_4_ =
                 fVar145 + auVar116._24_4_ * auVar148._24_4_ + fVar93 +
                 auVar105._24_4_ * auVar136._24_4_;
            auVar86._28_4_ = auVar148._28_4_ + 2.718064 + fVar134 + fVar134;
            auVar20._4_4_ = auVar86._4_4_ * -2.0;
            auVar20._0_4_ = auVar86._0_4_ * -2.0;
            auVar20._8_4_ = auVar86._8_4_ * -2.0;
            auVar20._12_4_ = auVar86._12_4_ * -2.0;
            auVar20._16_4_ = auVar86._16_4_ * -2.0;
            auVar20._20_4_ = auVar86._20_4_ * -2.0;
            auVar20._24_4_ = auVar86._24_4_ * -2.0;
            auVar20._28_4_ = 0xc0000000;
            auVar81 = vminps_avx(auVar151,auVar20);
            auVar110._8_4_ = 0xc2b0c0a5;
            auVar110._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar110._12_4_ = 0xc2b0c0a5;
            auVar110._16_4_ = 0xc2b0c0a5;
            auVar110._20_4_ = 0xc2b0c0a5;
            auVar110._24_4_ = 0xc2b0c0a5;
            auVar110._28_4_ = 0xc2b0c0a5;
            auVar95 = vmaxps_avx(auVar81,auVar110);
            auVar111._0_4_ = auVar95._0_4_ * 1.442695 + 0.5;
            auVar111._4_4_ = auVar95._4_4_ * 1.442695 + 0.5;
            auVar111._8_4_ = auVar95._8_4_ * 1.442695 + 0.5;
            auVar111._12_4_ = auVar95._12_4_ * 1.442695 + 0.5;
            auVar111._16_4_ = auVar95._16_4_ * 1.442695 + 0.5;
            auVar111._20_4_ = auVar95._20_4_ * 1.442695 + 0.5;
            auVar111._24_4_ = auVar95._24_4_ * 1.442695 + 0.5;
            auVar111._28_4_ = 0xc2afc0a5;
            auVar105 = vroundps_avx(auVar111,1);
            auVar81 = vcmpps_avx(auVar111,auVar105,1);
            auVar81 = vandps_avx(auVar81,auVar147);
            auVar81 = vsubps_avx(auVar105,auVar81);
            auVar21._4_4_ = auVar81._4_4_ * 0.6931472;
            auVar21._0_4_ = auVar81._0_4_ * 0.6931472;
            auVar21._8_4_ = auVar81._8_4_ * 0.6931472;
            auVar21._12_4_ = auVar81._12_4_ * 0.6931472;
            auVar21._16_4_ = auVar81._16_4_ * 0.6931472;
            auVar21._20_4_ = auVar81._20_4_ * 0.6931472;
            auVar21._24_4_ = auVar81._24_4_ * 0.6931472;
            auVar21._28_4_ = auVar105._28_4_;
            auVar95 = vsubps_avx(auVar95,auVar21);
            fVar135 = auVar95._0_4_;
            fVar140 = auVar95._4_4_;
            fVar141 = auVar95._8_4_;
            fVar134 = auVar95._12_4_;
            fVar80 = auVar95._16_4_;
            fVar88 = auVar95._20_4_;
            fVar89 = auVar95._24_4_;
            in_ZMM6 = ZEXT3264(CONCAT428(0x3e2aaaaa,
                                         CONCAT424(0x3e2aaaaa,
                                                   CONCAT420(0x3e2aaaaa,
                                                             CONCAT416(0x3e2aaaaa,
                                                                       CONCAT412(0x3e2aaaaa,
                                                                                 CONCAT48(0x3e2aaaaa
                                                                                          ,
                                                  0x3e2aaaaa3e2aaaaa)))))));
            auVar123._0_4_ =
                 (fVar125 + 1.0 +
                 fVar125 * fVar125 *
                 (((((fVar125 * 0.00019875691 + 0.0013981999) * fVar125 + 0.008333452) * fVar125 +
                   0.041665796) * fVar125 + 0.16666666) * fVar125 + 0.5)) * auVar103._0_4_ + 1.0;
            auVar123._4_4_ =
                 (fVar131 + 1.0 +
                 fVar131 * fVar131 *
                 (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
                   0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar103._4_4_ + 1.0;
            auVar123._8_4_ =
                 (fVar132 + 1.0 +
                 fVar132 * fVar132 *
                 (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) * fVar132 +
                   0.041665796) * fVar132 + 0.16666666) * fVar132 + 0.5)) * auVar103._8_4_ + 1.0;
            auVar123._12_4_ =
                 (fVar133 + 1.0 +
                 fVar133 * fVar133 *
                 (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) * fVar133 +
                   0.041665796) * fVar133 + 0.16666666) * fVar133 + 0.5)) * auVar103._12_4_ + 1.0;
            auVar123._16_4_ =
                 (fVar152 + 1.0 +
                 fVar152 * fVar152 *
                 (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                   0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5)) * auVar94._0_4_ + 1.0;
            auVar123._20_4_ =
                 (fVar9 + 1.0 +
                 fVar9 * fVar9 *
                 (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5)) * auVar94._4_4_ + 1.0;
            auVar123._24_4_ =
                 (fVar10 + 1.0 +
                 fVar10 * fVar10 *
                 (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10 +
                   0.041665796) * fVar10 + 0.16666666) * fVar10 + 0.5)) * auVar94._8_4_ + 1.0;
            auVar123._28_4_ = auVar82._28_4_ + 1.0 + auVar127._28_4_ + 1.0;
            auVar104._0_4_ = (int)auVar81._0_4_;
            auVar104._4_4_ = (int)auVar81._4_4_;
            auVar104._8_4_ = (int)auVar81._8_4_;
            auVar104._12_4_ = (int)auVar81._12_4_;
            auVar112._16_4_ = (int)auVar81._16_4_;
            auVar112._0_16_ = auVar104;
            auVar112._20_4_ = (int)auVar81._20_4_;
            auVar112._24_4_ = (int)auVar81._24_4_;
            auVar112._28_4_ = (int)auVar81._28_4_;
            auVar103 = vpslld_avx(auVar104,0x17);
            auVar94 = vpslld_avx(auVar112._16_16_,0x17);
            auVar94 = vpaddd_avx(auVar150,auVar94);
            auVar103 = vpaddd_avx(auVar150,auVar103);
            auVar100._0_4_ =
                 (fVar135 + 1.0 +
                 fVar135 * fVar135 *
                 (((((fVar135 * 0.00019875691 + 0.0013981999) * fVar135 + 0.008333452) * fVar135 +
                   0.041665796) * fVar135 + 0.16666666) * fVar135 + 0.5)) * auVar103._0_4_ + 1.0;
            auVar100._4_4_ =
                 (fVar140 + 1.0 +
                 fVar140 * fVar140 *
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5)) * auVar103._4_4_ + 1.0;
            auVar100._8_4_ =
                 (fVar141 + 1.0 +
                 fVar141 * fVar141 *
                 (((((fVar141 * 0.00019875691 + 0.0013981999) * fVar141 + 0.008333452) * fVar141 +
                   0.041665796) * fVar141 + 0.16666666) * fVar141 + 0.5)) * auVar103._8_4_ + 1.0;
            auVar100._12_4_ =
                 (fVar134 + 1.0 +
                 fVar134 * fVar134 *
                 (((((fVar134 * 0.00019875691 + 0.0013981999) * fVar134 + 0.008333452) * fVar134 +
                   0.041665796) * fVar134 + 0.16666666) * fVar134 + 0.5)) * auVar103._12_4_ + 1.0;
            auVar100._16_4_ =
                 (fVar80 + 1.0 +
                 fVar80 * fVar80 *
                 (((((fVar80 * 0.00019875691 + 0.0013981999) * fVar80 + 0.008333452) * fVar80 +
                   0.041665796) * fVar80 + 0.16666666) * fVar80 + 0.5)) * auVar94._0_4_ + 1.0;
            auVar100._20_4_ =
                 (fVar88 + 1.0 +
                 fVar88 * fVar88 *
                 (((((fVar88 * 0.00019875691 + 0.0013981999) * fVar88 + 0.008333452) * fVar88 +
                   0.041665796) * fVar88 + 0.16666666) * fVar88 + 0.5)) * auVar94._4_4_ + 1.0;
            auVar100._24_4_ =
                 (fVar89 + 1.0 +
                 fVar89 * fVar89 *
                 (((((fVar89 * 0.00019875691 + 0.0013981999) * fVar89 + 0.008333452) * fVar89 +
                   0.041665796) * fVar89 + 0.16666666) * fVar89 + 0.5)) * auVar94._8_4_ + 1.0;
            auVar100._28_4_ = auVar95._28_4_ + 1.0 + auVar105._28_4_ + 1.0;
            auVar81 = vrcpps_avx(auVar100);
            fVar125 = auVar81._0_4_;
            fVar135 = auVar81._4_4_;
            fVar131 = auVar81._8_4_;
            fVar140 = auVar81._12_4_;
            fVar132 = auVar81._16_4_;
            fVar141 = auVar81._20_4_;
            fVar133 = auVar81._24_4_;
            auVar22._4_4_ = auVar100._4_4_ * (fVar135 + fVar135);
            auVar22._0_4_ = auVar100._0_4_ * (fVar125 + fVar125);
            auVar22._8_4_ = auVar100._8_4_ * (fVar131 + fVar131);
            auVar22._12_4_ = auVar100._12_4_ * (fVar140 + fVar140);
            auVar22._16_4_ = auVar100._16_4_ * (fVar132 + fVar132);
            auVar22._20_4_ = auVar100._20_4_ * (fVar141 + fVar141);
            auVar22._24_4_ = auVar100._24_4_ * (fVar133 + fVar133);
            auVar22._28_4_ = auVar100._28_4_;
            auVar138._8_4_ = 0x40000000;
            auVar138._0_8_ = 0x4000000040000000;
            auVar138._12_4_ = 0x40000000;
            auVar138._16_4_ = 0x40000000;
            auVar138._20_4_ = 0x40000000;
            auVar138._24_4_ = 0x40000000;
            auVar138._28_4_ = 0x40000000;
            auVar105 = vsubps_avx(auVar138,auVar22);
            auVar95 = vrcpps_avx(auVar123);
            in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                         CONCAT424(0xbf800000,
                                                   CONCAT420(0xbf800000,
                                                             CONCAT416(0xbf800000,
                                                                       CONCAT412(0xbf800000,
                                                                                 CONCAT48(0xbf800000
                                                                                          ,
                                                  0xbf800000bf800000)))))));
            fVar134 = auVar81._28_4_ + auVar81._28_4_ + -1.0;
            auVar101._0_4_ = fVar125 + fVar125 + -1.0 + fVar125 * auVar105._0_4_;
            auVar101._4_4_ = fVar135 + fVar135 + -1.0 + fVar135 * auVar105._4_4_;
            auVar101._8_4_ = fVar131 + fVar131 + -1.0 + fVar131 * auVar105._8_4_;
            auVar101._12_4_ = fVar140 + fVar140 + -1.0 + fVar140 * auVar105._12_4_;
            auVar101._16_4_ = fVar132 + fVar132 + -1.0 + fVar132 * auVar105._16_4_;
            auVar101._20_4_ = fVar141 + fVar141 + -1.0 + fVar141 * auVar105._20_4_;
            auVar101._24_4_ = fVar133 + fVar133 + -1.0 + fVar133 * auVar105._24_4_;
            auVar101._28_4_ = fVar134 + auVar105._28_4_;
            fVar125 = auVar101._0_4_ * auVar95._0_4_;
            fVar135 = auVar101._4_4_ * auVar95._4_4_;
            fVar131 = auVar101._8_4_ * auVar95._8_4_;
            fVar140 = auVar101._12_4_ * auVar95._12_4_;
            fVar132 = auVar101._16_4_ * auVar95._16_4_;
            fVar141 = auVar101._20_4_ * auVar95._20_4_;
            fVar133 = auVar101._24_4_ * auVar95._24_4_;
            auVar23._4_4_ = auVar123._4_4_ * fVar135;
            auVar23._0_4_ = auVar123._0_4_ * fVar125;
            auVar23._8_4_ = auVar123._8_4_ * fVar131;
            auVar23._12_4_ = auVar123._12_4_ * fVar140;
            auVar23._16_4_ = auVar123._16_4_ * fVar132;
            auVar23._20_4_ = auVar123._20_4_ * fVar141;
            auVar23._24_4_ = auVar123._24_4_ * fVar133;
            auVar23._28_4_ = auVar123._28_4_;
            in_ZMM3 = ZEXT3264(auVar23);
            auVar81 = vsubps_avx(auVar101,auVar23);
            fVar125 = fVar125 + auVar95._0_4_ * auVar81._0_4_;
            fVar135 = fVar135 + auVar95._4_4_ * auVar81._4_4_;
            fVar131 = fVar131 + auVar95._8_4_ * auVar81._8_4_;
            fVar140 = fVar140 + auVar95._12_4_ * auVar81._12_4_;
            fVar132 = fVar132 + auVar95._16_4_ * auVar81._16_4_;
            fVar141 = fVar141 + auVar95._20_4_ * auVar81._20_4_;
            fVar133 = fVar133 + auVar95._24_4_ * auVar81._24_4_;
            fVar134 = fVar134 + auVar81._28_4_;
            *(undefined1 (*) [32])((long)pvVar47 + lVar30) = auVar86;
            pfVar3 = (float *)((long)local_2e0 + lVar30);
            *pfVar3 = fVar125;
            pfVar3[1] = fVar135;
            pfVar3[2] = fVar131;
            pfVar3[3] = fVar140;
            pfVar3[4] = fVar132;
            pfVar3[5] = fVar141;
            pfVar3[6] = fVar133;
            pfVar3[7] = fVar134;
            pfVar3 = (float *)((long)pvVar73 + lVar30);
            *pfVar3 = fVar125;
            pfVar3[1] = fVar135;
            pfVar3[2] = fVar131;
            pfVar3[3] = fVar140;
            pfVar3[4] = fVar132;
            pfVar3[5] = fVar141;
            pfVar3[6] = fVar133;
            pfVar3[7] = fVar134;
            uVar36 = uVar36 - 1;
            lVar30 = lVar30 + 0x20;
          } while (1 < uVar36);
          pAVar56 = pAVar56 + lVar30;
          pAVar53 = pAVar53 + lVar30;
          pAVar45 = pAVar45 + lVar30;
          pAVar62 = (Allocator *)((long)local_78.data + lVar30);
          local_2e0 = (void *)((long)local_2e0 + lVar30);
          pvVar47 = (void *)((long)pvVar47 + lVar30);
          pvVar73 = (void *)((long)pvVar73 + lVar30);
        }
        if (uVar59 != 0) {
          lVar30 = 0;
          iVar35 = iVar27;
          do {
            fVar125 = *(float *)(pAVar56 + lVar30);
            in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
            in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
            in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            fVar135 = expf(-*(float *)(pAVar62 + lVar30));
            fVar131 = expf(-*(float *)(pAVar45 + lVar30));
            fVar140 = expf(-*(float *)(pAVar53 + lVar30));
            fVar125 = tanhf(fVar125);
            fVar125 = *(float *)((long)pvVar47 + lVar30) / (fVar131 + 1.0) +
                      fVar125 / (fVar135 + 1.0);
            fVar135 = tanhf(fVar125);
            fVar135 = fVar135 / (fVar140 + 1.0);
            *(float *)((long)pvVar47 + lVar30) = fVar125;
            *(float *)((long)local_2e0 + lVar30) = fVar135;
            *(float *)((long)pvVar73 + lVar30) = fVar135;
            iVar35 = iVar35 + -1;
            lVar30 = lVar30 + 4;
          } while (1 < iVar35);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar6);
    }
    iVar27 = 0;
  }
  piVar25 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_78.data != (Allocator *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (**(code **)(*(long *)local_78.allocator + 0x18))();
      }
    }
  }
  return iVar27;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanh(cell2);
            cell_state[q] = cell2;
            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}